

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  size_t err_code;
  size_t sVar1;
  ZSTD_inBuffer *pZVar2;
  long lVar3;
  bool bVar4;
  ZSTD_inBuffer input;
  ZSTD_inBuffer nullInput;
  ZSTD_inBuffer local_48;
  ZSTD_inBuffer local_28;
  
  local_28.src = (void *)0x0;
  local_28.size = 0;
  local_28.pos = 0;
  pZVar2 = &zcs->expectedInBuffer;
  if ((zcs->appliedParams).inBufferMode != ZSTD_bm_stable) {
    pZVar2 = &local_28;
  }
  local_48.pos = pZVar2->pos;
  local_48.src = pZVar2->src;
  local_48.size = pZVar2->size;
  sVar1 = ZSTD_compressStream2(zcs,output,&local_48,ZSTD_e_end);
  if ((sVar1 < 0xffffffffffffff89) && ((zcs->appliedParams).nbWorkers < 1)) {
    bVar4 = zcs->frameEnded == 0;
    if (bVar4) {
      lVar3 = (long)(zcs->appliedParams).fParams.checksumFlag << 2;
    }
    else {
      lVar3 = 0;
    }
    sVar1 = (ulong)bVar4 * 3 + sVar1 + lVar3;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = inBuffer_forEndFlush(zcs);
    size_t const remainingToFlush = ZSTD_compressStream2(zcs, output, &input, ZSTD_e_end);
    FORWARD_IF_ERROR(remainingToFlush , "ZSTD_compressStream2(,,ZSTD_e_end) failed");
    if (zcs->appliedParams.nbWorkers > 0) return remainingToFlush;   /* minimal estimation */
    /* single thread mode : attempt to calculate remaining to flush more precisely */
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = (size_t)(zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4);
        size_t const toFlush = remainingToFlush + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (unsigned)toFlush);
        return toFlush;
    }
}